

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_SYNDICATED_C2_REQ::data(SRUP_MSG_SYNDICATED_C2_REQ *this,uint64_t data)

{
  uint8_t *puVar1;
  uint8_t len;
  uint64_t data_local;
  SRUP_MSG_SYNDICATED_C2_REQ *this_local;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if ((this->m_data != (uint8_t *)0x0) && (this->m_data != (uint8_t *)0x0)) {
    operator_delete__(this->m_data);
  }
  puVar1 = (uint8_t *)operator_new__(8);
  this->m_data = puVar1;
  *(uint64_t *)this->m_data = data;
  this->m_data_len = 8;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::data(const uint64_t data)
{
    m_is_serialized = false;
    const uint8_t len = 8;

    if (m_data != nullptr)
        delete[] m_data;

    m_data = new uint8_t[len];
    std::memcpy(m_data, &data, len);
    m_data_len = len;
    return true;
}